

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.cpp
# Opt level: O2

endpoint __thiscall booster::aio::basic_socket::remote_endpoint(basic_socket *this,error_code *e)

{
  native_type __fd;
  int iVar1;
  int *in_RDX;
  error_code eVar2;
  socklen_t len;
  vector<char,_std::allocator<char>_> endpoint_raw_;
  allocator_type local_4d;
  uint local_4c;
  _Vector_base<char,_std::allocator<char>_> local_48;
  
  local_4c = local_4c & 0xffffff00;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_48,1000,(value_type *)&local_4c,&local_4d
            );
  local_4c = (int)local_48._M_impl.super__Vector_impl_data._M_finish -
             (int)local_48._M_impl.super__Vector_impl_data._M_start;
  endpoint::endpoint((endpoint *)this);
  __fd = basic_io_device::native((basic_io_device *)e);
  iVar1 = getpeername(__fd,(sockaddr *)local_48._M_impl.super__Vector_impl_data._M_start,&local_4c);
  if (iVar1 < 0) {
    eVar2 = socket_details::geterror();
    *in_RDX = eVar2._M_value;
    *(error_category **)(in_RDX + 2) = eVar2._M_cat;
  }
  else {
    endpoint::raw((endpoint *)this,(sockaddr *)local_48._M_impl.super__Vector_impl_data._M_start,
                  local_4c);
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_48);
  return (endpoint)(copy_ptr<booster::aio::endpoint::data>)this;
}

Assistant:

endpoint basic_socket::remote_endpoint(system::error_code &e)
{
	std::vector<char> endpoint_raw_(1000,0);
	sockaddr *sa = reinterpret_cast<sockaddr *>(&endpoint_raw_.front());
	socklen_t len = endpoint_raw_.size();
	endpoint ep;
	if(::getpeername(native(),sa,&len) < 0) 
		e=geterror();
	else
		ep.raw(sa,len);
	return ep;
}